

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::VectorDCE::GetVectorComponentCount(VectorDCE *this,uint32_t type_id)

{
  int iVar1;
  TypeManager *this_00;
  Type *pTVar2;
  undefined4 extraout_var;
  
  if (type_id == 0) {
    __assert_fail("type_id != 0 && \"Trying to get the vector element count, but the type id is 0\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp"
                  ,0x12e,"uint32_t spvtools::opt::VectorDCE::GetVectorComponentCount(uint32_t)");
  }
  this_00 = IRContext::get_type_mgr((this->super_MemPass).super_Pass.context_);
  pTVar2 = analysis::TypeManager::GetType(this_00,type_id);
  iVar1 = (*pTVar2->_vptr_Type[0xe])(pTVar2);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    return *(uint32_t *)(CONCAT44(extraout_var,iVar1) + 0x30);
  }
  __assert_fail("vector_type && \"Trying to get the vector element count, but the type is not a vector\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp"
                ,0x134,"uint32_t spvtools::opt::VectorDCE::GetVectorComponentCount(uint32_t)");
}

Assistant:

uint32_t VectorDCE::GetVectorComponentCount(uint32_t type_id) {
  assert(type_id != 0 &&
         "Trying to get the vector element count, but the type id is 0");
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  const analysis::Type* type = type_mgr->GetType(type_id);
  const analysis::Vector* vector_type = type->AsVector();
  assert(
      vector_type &&
      "Trying to get the vector element count, but the type is not a vector");
  return vector_type->element_count();
}